

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

uint64 Time::multDiv(uint64 a,uint64 b,uint64 c)

{
  bool bVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong local_a8;
  uint64 q0;
  uint64 rhat;
  uint64 q1;
  uint64 p2;
  uint64 p1;
  uint64 p0;
  uint64 cl;
  uint64 ch;
  uint64 bl;
  uint64 bh;
  uint64 al;
  uint64 ah;
  uint64 norm;
  uint64 res;
  uint64 maxdiv;
  uint64 base;
  uint64 c_local;
  uint64 b_local;
  uint64 a_local;
  
  a_local = (a / c) * b + (a % c) * (b / c);
  uVar11 = a % c;
  uVar12 = b % c;
  if ((uVar11 != 0) && (uVar12 != 0)) {
    if (c < 0x100000000) {
      a_local = a_local + (uVar11 * uVar12) / c;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = c;
      lVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0);
      uVar4 = lVar3 * c;
      uVar11 = lVar3 * uVar11;
      uVar5 = uVar11 >> 0x20;
      uVar11 = uVar11 & 0xffffffff;
      uVar6 = uVar4 >> 0x20;
      uVar7 = uVar4 & 0xffffffff;
      uVar8 = uVar11 * (uVar12 & 0xffffffff);
      uVar11 = (uVar8 >> 0x20) + uVar11 * (uVar12 >> 0x20);
      uVar9 = (uVar11 & 0xffffffff) + uVar5 * (uVar12 & 0xffffffff);
      uVar10 = uVar9 & 0xffffffff;
      uVar4 = ((uVar9 >> 0x20) + (uVar11 >> 0x20) + uVar5 * (uVar12 >> 0x20)) % uVar4;
      rhat = uVar4 / uVar6;
      q0 = uVar4 % uVar6;
      while( true ) {
        bVar1 = true;
        if ((rhat < 0x100000000) && (bVar1 = false, q0 < 0x100000000)) {
          uVar11 = (q0 << 0x20) + uVar10;
          bVar1 = uVar11 <= rhat * uVar7 && rhat * uVar7 - uVar11 != 0;
        }
        if (!bVar1) break;
        rhat = rhat - 1;
        q0 = uVar6 + q0;
      }
      uVar11 = ((uVar4 << 0x20) + uVar10) - rhat * uVar7;
      uVar11 = (uVar11 & 0xffffffff) + ((uVar11 >> 0x20) - rhat * uVar6 << 0x20);
      local_a8 = uVar11 / uVar6;
      q0 = uVar11 % uVar6;
      while( true ) {
        bVar1 = true;
        if ((local_a8 < 0x100000000) && (bVar1 = false, q0 < 0x100000000)) {
          uVar11 = (q0 << 0x20) + (uVar8 & 0xffffffff);
          bVar1 = uVar11 <= local_a8 * uVar7 && local_a8 * uVar7 - uVar11 != 0;
        }
        if (!bVar1) break;
        local_a8 = local_a8 - 1;
        q0 = uVar6 + q0;
      }
      a_local = a_local + local_a8 + (rhat << 0x20);
    }
  }
  return a_local;
}

Assistant:

uint64 multDiv(uint64 a, uint64 b, uint64 c)
    {
        uint64 const base = 1ULL<<32;
        uint64 const maxdiv = (base-1) * base + (base-1);

        // First get the easy thing
        uint64 res = (a/c) * b + (a%c) * (b/c);
        a %= c;
        b %= c;
        // Are we done?
        if (a == 0 || b == 0)
            return res;
        // Is it easy to compute what remain to be added?
        if (c < base)
            return res + (a*b/c);
        // Now 0 < a < c, 0 < b < c, c >= 1ULL
        // Normalize
        uint64 norm = maxdiv/c;
        c *= norm;
        a *= norm;
        // split into 2 digits
        uint64 ah = a / base, al = a % base;
        uint64 bh = b / base, bl = b % base;
        uint64 ch = c / base, cl = c % base;
        // compute the product
        uint64 p0 = al*bl;
        uint64 p1 = p0 / base + al*bh;
        p0 %= base;
        uint64 p2 = p1 / base + ah*bh;
        p1 = (p1 % base) + ah * bl;
        p2 += p1 / base;
        p1 %= base;
        // p2 holds 2 digits, p1 and p0 one
        
        // first digit is easy, not null only in case of overflow
        // uint64 q2 = p2 / c;
        p2 = p2 % c;
        
        // second digit, estimate
        uint64 q1 = p2 / ch;
        // and now adjust
        uint64 rhat = p2 % ch;
        // the loop can be unrolled, it will be executed at most twice for
        // even bases -- three times for odd one -- due to the normalisation above
        while (q1 >= base || (rhat < base && q1*cl > rhat*base+p1)) {
            q1--;
            rhat += ch;
        }
        // subtract
        p1 = ((p2 % base) * base + p1) - q1 * cl;
        p2 = (p2 / base * base + p1 / base) - q1 * ch;
        p1 = p1 % base + (p2 % base) * base;
        
        // now p1 hold 2 digits, p0 one and p2 is to be ignored
        uint64 q0 = p1 / ch;
        rhat = p1 % ch;
        while (q0 >= base || (rhat < base && q0*cl > rhat*base+p0)) {
            q0--;
            rhat += ch;
        }
        // we don't need to do the subtraction (needed only to get the remainder,
        // in which case we have to divide it by norm)
        return res + q0 + q1 * base; // + q2 *base*base
    }